

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

void Dau_DecFindSetsTest2(void)

{
  Vec_Int_t *vSets;
  word t;
  word local_10;
  
  local_10 = 0xfebadc9876325410;
  vSets = Dau_DecFindSets(&local_10,5);
  Dau_DecPrintSets(vSets,5);
  if (vSets->pArray != (int *)0x0) {
    free(vSets->pArray);
  }
  free(vSets);
  return;
}

Assistant:

void Dau_DecFindSetsTest2()
{
    Vec_Int_t * vSets;
    word a0 = (~s_Truths6[1] & s_Truths6[2]) | (s_Truths6[1] & s_Truths6[3]);
    word a1 = (~s_Truths6[1] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[5]);
    word t  = (~s_Truths6[0] & a0)           | (s_Truths6[0] & a1); 
//    word t = ABC_CONST(0x7EFFFFFFFFFFFF7E); // and(gam1,gam2)
//    word t = ABC_CONST(0xB0F0BBFFB0F0BAFE); // some funct
//    word t = ABC_CONST(0x2B0228022B022802); // 5-var non-dec0x0F7700000F770000
//    word t = ABC_CONST(0x0F7700000F770000); // (!<(ab)cd>e)
//    word t = ABC_CONST(0x7F00000000000000); // (!(abc)def)
    int nVars = 5;

    vSets   = Dau_DecFindSets( &t, nVars );
    Dau_DecPrintSets( vSets, nVars );
    Vec_IntFree( vSets );
}